

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessSamplersTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Samplers::DefaultsTest::testSamplerFloatParameter
          (DefaultsTest *this,GLenum pname,GLfloat expected_value)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  char *__s;
  size_t sVar2;
  float fVar3;
  GLfloat value;
  float local_1bc;
  float local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined1 local_1a0 [8];
  _func_int **local_198;
  ios_base local_128 [264];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1bc = -1.0;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0xa48))(this->m_sampler_dsa,pname,&local_1bc);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glGetSamplerParameteriv have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessSamplersTests.cpp"
                  ,0x130);
  fVar3 = expected_value - local_1bc;
  local_1b8 = -fVar3;
  if (-fVar3 <= fVar3) {
    local_1b8 = fVar3;
  }
  if (0.015625 < local_1b8) {
    uStack_1b4 = 0x80000000;
    uStack_1b0 = 0x80000000;
    uStack_1ac = 0x80000000;
    local_1a0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198,"glGetSamplerParameterfv with parameter ",0x27);
    __s = glu::getTextureParameterName(pname);
    if (__s == (char *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_198 + (int)local_198[-3]);
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,__s,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198," has returned ",0xe);
    std::ostream::_M_insert<double>((double)local_1bc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,", however ",10);
    std::ostream::_M_insert<double>((double)expected_value);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198," was expected.",0xe);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
    std::ios_base::~ios_base(local_128);
  }
  return local_1b8 <= 0.015625;
}

Assistant:

bool DefaultsTest::testSamplerFloatParameter(glw::GLenum pname, glw::GLfloat expected_value)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get data. */
	glw::GLfloat value = -1.0;

	gl.getSamplerParameterfv(m_sampler_dsa, pname, &value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetSamplerParameteriv have failed");

	if (de::abs(expected_value - value) > 0.015625f /* Precision */)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "glGetSamplerParameterfv with parameter "
											<< glu::getTextureParameterName(pname) << " has returned " << value
											<< ", however " << expected_value << " was expected."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}